

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_escape.cpp
# Opt level: O2

string_t duckdb::EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t *input,Vector *result)

{
  StringPiece *unquoted;
  anon_union_16_2_67f50693_for_value aVar1;
  string escaped_pattern;
  string local_60;
  string local_40;
  string *local_20;
  size_type sStack_18;
  
  string_t::GetString_abi_cxx11_(&local_40,input);
  local_20 = (string *)local_40._M_dataplus._M_p;
  sStack_18 = local_40._M_string_length;
  duckdb_re2::RE2::QuoteMeta_abi_cxx11_(&local_60,(RE2 *)&stack0xffffffffffffffe0,unquoted);
  ::std::__cxx11::string::~string((string *)&local_40);
  aVar1.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(result,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE &input, Vector &result) {
		auto escaped_pattern = RE2::QuoteMeta(input.GetString());
		return StringVector::AddString(result, escaped_pattern);
	}